

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O1

void __thiscall
ScriptBuilder_StringBuildTest_Test::~ScriptBuilder_StringBuildTest_Test
          (ScriptBuilder_StringBuildTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptBuilder, StringBuildTest) {
  Script script;
  ScriptBuilder sb = ScriptBuilder();
  sb.AppendString("5");
  sb.AppendString("2");
  sb.AppendString("OP_ADD");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), "555293ac");
  EXPECT_STREQ(script.ToString().c_str(), "5 2 OP_ADD OP_CHECKSIG");

  sb = ScriptBuilder();
  sb.AppendString("0");
  sb.AppendString("17");
  sb.AppendString("8738");
  sb.AppendString("3355443");
  sb.AppendString("17476");
  sb.AppendString("85");
  sb.AppendString("26214");
  sb.AppendString("7829367");
  sb.AppendString("-2184");
  sb.AppendString("-25");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "000111022222033333330244440155026666037777770288880199");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  sb = ScriptBuilder();
  sb.AppendString("304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e");
  sb.AppendString("042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0");
  sb.AppendString("144");
  sb.AppendString("OP_CHECKLOCKTIMEVERIFY");
  sb.AppendString("OP_DROP");
  sb.AppendString("1469272661");
  sb.AppendString("OP_SHA256");
  sb.AppendString("f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4");
  sb.AppendString("OP_EQUALVERIFY");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), expect_hex.c_str());
  EXPECT_STREQ(script.ToString().c_str(), expect_asm.c_str());

  // hex test
  sb = ScriptBuilder();
  sb.AppendString("0x00");
  sb.AppendString("0x11");
  sb.AppendString("0x2222");
  sb.AppendString("0x333333");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "0100011102222203333333");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443");
}